

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

bool __thiscall QTreeViewPrivate::expandOrCollapseItemAtPos(QTreeViewPrivate *this,QPoint *pos)

{
  bool bVar1;
  int iVar2;
  QTreeViewPrivate *this_00;
  const_reference pQVar3;
  bool in_SIL;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTreeView *q;
  QWidget *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  byte bVar4;
  undefined4 in_stack_ffffffffffffffc0;
  bool local_19;
  undefined1 local_18 [3];
  QTreeViewPrivate *this_01;
  QTreeViewPrivate *this_02;
  
  this_02 = *(QTreeViewPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = (QTreeViewPrivate *)q_func(in_RDI);
  if (((in_RDI->super_QAbstractItemViewPrivate).state == NoState) ||
     (bVar4 = 1, (in_RDI->super_QAbstractItemViewPrivate).state == EditingState)) {
    _local_18 = QWidget::rect((QWidget *)this_00);
    bVar4 = QRect::contains((QPoint *)local_18,in_SIL);
    bVar4 = bVar4 ^ 0xff;
  }
  if ((bVar4 & 1) == 0) {
    iVar2 = itemDecorationAt(this_02,(QPoint *)this_01);
    if ((iVar2 != -1) && ((in_RDI->itemsExpandable & 1U) != 0)) {
      QList<QTreeViewItem>::at
                ((QList<QTreeViewItem> *)
                 CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                 (qsizetype)in_stack_ffffffffffffffa8);
      bVar1 = hasVisibleChildren(this_00,(QModelIndex *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
      if (bVar1) {
        pQVar3 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)
                            CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffb6,
                                                    in_stack_ffffffffffffffb0)),
                            (qsizetype)in_stack_ffffffffffffffa8);
        if ((*(ulong *)&pQVar3->field_0x1c & 1) == 0) {
          expand((QTreeViewPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        }
        else {
          collapse(this_01,local_18._4_4_,local_18[3]);
        }
        bVar1 = QAbstractItemViewPrivate::isAnimating(&in_RDI->super_QAbstractItemViewPrivate);
        if (!bVar1) {
          (**(code **)(*(long *)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate + 0x268))();
          QWidget::update(in_stack_ffffffffffffffa8);
        }
        local_19 = true;
        goto LAB_008f58ec;
      }
    }
    local_19 = false;
  }
  else {
    local_19 = true;
  }
LAB_008f58ec:
  if (*(QTreeViewPrivate **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QTreeViewPrivate::expandOrCollapseItemAtPos(const QPoint &pos)
{
    Q_Q(QTreeView);
    // we want to handle mousePress in EditingState (persistent editors)
    if ((state != QAbstractItemView::NoState
                && state != QAbstractItemView::EditingState)
                || !viewport->rect().contains(pos))
        return true;

    int i = itemDecorationAt(pos);
    if ((i != -1) && itemsExpandable && hasVisibleChildren(viewItems.at(i).index)) {
        if (viewItems.at(i).expanded)
            collapse(i, true);
        else
            expand(i, true);
        if (!isAnimating()) {
            q->updateGeometries();
            viewport->update();
        }
        return true;
    }
    return false;
}